

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::SortingColumn::read(SortingColumn *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _func_int **pp_Var5;
  undefined8 *puVar6;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  TType ftype;
  bool *local_68;
  bool *local_60;
  int32_t *local_58;
  string fname;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&fname);
  local_60 = &this->nulls_first;
  local_68 = &this->descending;
  local_58 = &this->column_idx;
  local_70 = 0;
  local_78 = 0;
  local_74 = 0;
  do {
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&fname,&ftype,&fid);
    if (ftype == T_STOP) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (((byte)local_70 & (byte)local_78 & (byte)local_74 & 1) != 0) {
        std::__cxx11::string::~string((string *)&fname);
        this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar3 + iVar2 + iVar1);
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar6[1] = puVar6 + 3;
      puVar6[2] = 0;
      *(undefined1 *)(puVar6 + 3) = 0;
      *puVar6 = &PTR__TException_027d9f90;
      *(undefined4 *)(puVar6 + 5) = 1;
      __cxa_throw(puVar6,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                  duckdb_apache::thrift::TException::~TException);
    }
    if (fid == 3) {
      pp_Var5 = this_00->_vptr_TProtocol;
      if (ftype != T_BOOL) goto LAB_01ee4208;
      iVar3 = (*pp_Var5[0x23])(this_00,local_60);
      local_74 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    }
    else {
      if (fid == 2) {
        pp_Var5 = this_00->_vptr_TProtocol;
        if (ftype == T_BOOL) {
          iVar3 = (*pp_Var5[0x23])(this_00,local_68);
          local_78 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
          goto LAB_01ee4214;
        }
      }
      else if (fid == 1) {
        pp_Var5 = this_00->_vptr_TProtocol;
        if (ftype == T_I32) {
          iVar3 = (*pp_Var5[0x27])(this_00,local_58);
          local_70 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
          goto LAB_01ee4214;
        }
      }
      else {
        pp_Var5 = this_00->_vptr_TProtocol;
      }
LAB_01ee4208:
      iVar3 = (*pp_Var5[0x2c])(this_00);
    }
LAB_01ee4214:
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  } while( true );
}

Assistant:

uint32_t SortingColumn::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_column_idx = false;
  bool isset_descending = false;
  bool isset_nulls_first = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->column_idx);
          isset_column_idx = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->descending);
          isset_descending = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->nulls_first);
          isset_nulls_first = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_column_idx)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_descending)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_nulls_first)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}